

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::
allocCallbackFailMultipleObjectsTest<vkt::api::(anonymous_namespace)::DescriptorSet>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  deInt32 *pdVar1;
  ostringstream *this;
  pointer pbVar2;
  PlatformInterface *pPVar3;
  char *pcVar4;
  Context *this_00;
  ulong uVar5;
  VkResult value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar6;
  void *__s;
  VkAllocationCallbacks *allocator;
  DeviceInterface *pDVar7;
  VkDevice pVVar8;
  Move<vk::Handle<(vk::HandleType)22>_> *pMVar9;
  Checked<vk::Handle<(vk::HandleType)22>_> CVar10;
  ulong uVar11;
  undefined8 *puVar12;
  deUint32 numPassingAllocs;
  char **value_00;
  int iVar13;
  long lVar14;
  ulong uVar15;
  undefined8 uVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  bool bVar18;
  vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
  descriptorSetLayouts;
  VkDescriptorSetAllocateInfo allocateInfo;
  vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>_>_>
  scopedHandles;
  Resources res;
  Environment objEnv;
  size_type __dnew;
  DeterministicFailAllocator objAllocator;
  SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_> local_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_330;
  string *local_328;
  Context *local_320;
  vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_> local_318
  ;
  string local_300;
  pointer local_2e0;
  pointer local_2d8;
  pointer local_2d0;
  Parameters *local_2c8;
  size_t local_2c0;
  vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>_>_>
  local_2b8;
  undefined1 local_298 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288 [5];
  value_type local_230 [2];
  ios_base local_220 [264];
  Environment local_118;
  AllocationCallbackRecorder local_e0;
  DeterministicFailAllocator local_80;
  
  local_e0.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks =
       (_func_int **)0x13;
  local_2c8 = params;
  local_298._0_8_ = local_288;
  local_298._0_8_ = std::__cxx11::string::_M_create((ulong *)local_298,(ulong)&local_e0);
  local_288[0]._M_allocated_capacity =
       local_e0.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks;
  *(undefined8 *)local_298._0_8_ = 0x6d5f52484b5f4b56;
  *(undefined8 *)(local_298._0_8_ + 8) = 0x6e616e65746e6961;
  builtin_strncpy((char *)((long)(local_298._0_8_ + 8) + 7),"nce1",4);
  local_298._8_8_ =
       local_e0.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks;
  *(char *)((long)local_e0.super_ChainedAllocator.super_AllocationCallbacks.
                  _vptr_AllocationCallbacks + local_298._0_8_) = '\0';
  pvVar6 = Context::getDeviceExtensions_abi_cxx11_(context);
  pbVar2 = (pvVar6->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar6 = Context::getDeviceExtensions_abi_cxx11_(context);
  local_2d0 = (pvVar6->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_2d8 = (pointer)std::
                       __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                 (pbVar2,local_2d0,local_298);
  local_320 = context;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._0_8_ != local_288) {
    operator_delete((void *)local_298._0_8_,local_288[0]._M_allocated_capacity + 1);
  }
  __s = operator_new(0x20);
  local_328 = (string *)&__return_storage_ptr__->m_description;
  local_330 = &(__return_storage_ptr__->m_description).field_2;
  uVar15 = (long)__s + 8U;
  if ((long)__s + 8U < (long)__s + 0x20U) {
    uVar15 = (long)__s + 0x20U;
  }
  local_2c0 = (~(ulong)__s + uVar15 & 0xfffffffffffffff8) + 8;
  uVar15 = 0;
  do {
    memset(__s,0xde,local_2c0);
    allocator = ::vk::getSystemAllocator();
    ::vk::DeterministicFailAllocator::DeterministicFailAllocator
              (&local_80,allocator,MODE_DO_NOT_COUNT,0);
    ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
              (&local_e0,&local_80.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks,0x80
              );
    this_00 = local_320;
    pPVar3 = local_320->m_platformInterface;
    pDVar7 = Context::getDeviceInterface(local_320);
    pVVar8 = Context::getDevice(this_00);
    local_118.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(this_00);
    local_118.programBinaries = this_00->m_progCollection;
    local_118.allocationCallbacks =
         &local_e0.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
    local_118.maxResourceConsumers = 4;
    local_298._0_8_ = this_00->m_testCtx->m_log;
    this = (ostringstream *)(local_298 + 8);
    local_118.vkp = pPVar3;
    local_118.vkd = pDVar7;
    local_118.device = pVVar8;
    std::__cxx11::ostringstream::ostringstream(this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"Trying to create ",0x11);
    std::ostream::_M_insert<unsigned_long>((ulong)this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," objects with ",0xe);
    std::ostream::_M_insert<unsigned_long>((ulong)this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," allocation",0xb);
    pcVar4 = ",\n\t\t";
    if (uVar15 != 1) {
      pcVar4 = "%s<%s";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this,pcVar4 + 4,(ulong)(uVar15 != 1));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(local_298 + 8)," passing",8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_298,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_298 + 8));
    std::ios_base::~ios_base(local_220);
    DescriptorSet::Resources::Resources((Resources *)local_298,&local_118,local_2c8);
    numPassingAllocs = (deUint32)uVar15;
    ::vk::DeterministicFailAllocator::reset(&local_80,MODE_COUNT_AND_FAIL,numPassingAllocs);
    std::vector<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>::
    vector(&local_318,4,local_230,(allocator_type *)&local_300);
    local_300._M_dataplus._M_p._0_4_ = 0x22;
    local_300._M_string_length = 0;
    local_300.field_2._M_allocated_capacity = local_298._8_8_;
    local_300.field_2._8_4_ = 4;
    local_2e0 = local_318.
                super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    value = (*pDVar7->_vptr_DeviceInterface[0x3c])(pDVar7,pVVar8,&local_300);
    local_2b8.
    super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8.
    super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2b8.
    super__Vector_base<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (value == VK_SUCCESS) {
      lVar14 = 0;
      do {
        pMVar9 = (Move<vk::Handle<(vk::HandleType)22>_> *)operator_new(0x20);
        CVar10 = ::vk::refdetails::check<vk::Handle<(vk::HandleType)22>>
                           ((Handle<(vk::HandleType)22>)*(deUint64 *)((long)__s + lVar14 * 8));
        (pMVar9->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
             (deUint64)CVar10.object.m_internal;
        (pMVar9->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_deviceIface =
             local_118.vkd;
        (pMVar9->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_device =
             local_118.device;
        (pMVar9->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.deleter.m_pool.m_internal =
             local_298._8_8_;
        local_348.m_state = (SharedPtrStateBase *)0x0;
        local_348.m_ptr = pMVar9;
        local_348.m_state = (SharedPtrStateBase *)operator_new(0x20);
        (local_348.m_state)->strongRefCount = 0;
        (local_348.m_state)->weakRefCount = 0;
        (local_348.m_state)->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00d1e2d0;
        local_348.m_state[1]._vptr_SharedPtrStateBase = (_func_int **)pMVar9;
        (local_348.m_state)->strongRefCount = 1;
        (local_348.m_state)->weakRefCount = 1;
        std::
        vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>>>,std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>>>>>
        ::emplace_back<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>>>>
                  ((vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>>>,std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>>>>>
                    *)&local_2b8,&local_348);
        if (local_348.m_state != (SharedPtrStateBase *)0x0) {
          LOCK();
          pdVar1 = &(local_348.m_state)->strongRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            local_348.m_ptr = (Move<vk::Handle<(vk::HandleType)22>_> *)0x0;
            (*(local_348.m_state)->_vptr_SharedPtrStateBase[2])();
          }
          LOCK();
          pdVar1 = &(local_348.m_state)->weakRefCount;
          *pdVar1 = *pdVar1 + -1;
          UNLOCK();
          if (*pdVar1 == 0) {
            if (local_348.m_state != (SharedPtrStateBase *)0x0) {
              (*(local_348.m_state)->_vptr_SharedPtrStateBase[1])();
            }
            local_348.m_state = (SharedPtrStateBase *)0x0;
          }
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 4);
    }
    if (local_318.
        super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_318.
                      super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_318.
                            super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_318.
                            super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>_>_>_>
    ::~vector(&local_2b8);
    DescriptorSet::Resources::~Resources((Resources *)local_298);
    if (value == VK_SUCCESS) {
      local_298._0_8_ = local_320->m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_298 + 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_298 + 8),"Construction of all objects succeeded! ",0x27);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_298,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_298 + 8));
      std::ios_base::~ios_base(local_220);
      iVar13 = 2;
    }
    else {
      if (local_2d8 != local_2d0) {
        iVar13 = 5;
        bVar18 = 3 < uVar15;
        if (!bVar18) {
          uVar5 = uVar15;
          if (*(long *)((long)__s + uVar15 * 8) == 0) {
            do {
              uVar11 = uVar5;
              bVar18 = 2 < uVar11;
              if (uVar11 == 3) goto LAB_004066e5;
              uVar5 = uVar11 + 1;
            } while (*(long *)((long)__s + uVar11 * 8 + 8) == 0);
            bVar18 = 2 < uVar11;
          }
          local_298._0_8_ = local_288;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_298,"Some object handles weren\'t set to NULL","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_330;
          std::__cxx11::string::_M_construct<char*>
                    (local_328,local_298._0_8_,(char *)(local_298._0_8_ + local_298._8_8_));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._0_8_ != local_288) {
            operator_delete((void *)local_298._0_8_,local_288[0]._M_allocated_capacity + 1);
          }
          iVar13 = 1;
        }
LAB_004066e5:
        if (!bVar18) goto LAB_00406921;
      }
      if (value == VK_ERROR_OUT_OF_HOST_MEMORY) {
        bVar18 = ::vk::validateAndLog(local_320->m_testCtx->m_log,&local_e0,0);
        iVar13 = 0;
        if (bVar18) goto LAB_00406921;
        local_298._0_8_ = local_288;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_298,"Invalid allocation callback","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_330;
        std::__cxx11::string::_M_construct<char*>
                  (local_328,local_298._0_8_,(char *)(local_298._0_8_ + local_298._8_8_));
        uVar16 = local_288[0]._M_allocated_capacity;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_298._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._0_8_ != local_288) goto LAB_00406914;
      }
      else {
        local_318.
        super__Vector_base<vk::Handle<(vk::HandleType)19>,_std::allocator<vk::Handle<(vk::HandleType)19>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)::vk::getResultName(value);
        de::toString<char_const*>(&local_300,(de *)&local_318,value_00);
        puVar12 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_300,0,(char *)0x0,0xacbb28);
        local_298._0_8_ = local_288;
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar12 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar12 == paVar17) {
          local_288[0]._0_8_ = paVar17->_M_allocated_capacity;
          local_288[0]._8_4_ = *(undefined4 *)(puVar12 + 3);
          local_288[0]._12_4_ = *(undefined4 *)((long)puVar12 + 0x1c);
        }
        else {
          local_288[0]._0_8_ = paVar17->_M_allocated_capacity;
          local_298._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar12;
        }
        local_298._8_8_ = puVar12[1];
        *puVar12 = paVar17;
        puVar12[1] = 0;
        *(undefined1 *)(puVar12 + 2) = 0;
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_330;
        std::__cxx11::string::_M_construct<char*>
                  (local_328,local_298._0_8_,(char *)(local_298._0_8_ + local_298._8_8_));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._0_8_ != local_288) {
          operator_delete((void *)local_298._0_8_,local_288[0]._M_allocated_capacity + 1);
        }
        paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_300._M_dataplus._M_p._4_4_,local_300._M_dataplus._M_p._0_4_);
        uVar16 = local_300.field_2._M_allocated_capacity;
        if (paVar17 != &local_300.field_2) {
LAB_00406914:
          operator_delete(paVar17,uVar16 + 1);
        }
      }
      iVar13 = 1;
    }
LAB_00406921:
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_e0);
    ::vk::ChainedAllocator::~ChainedAllocator(&local_80.super_ChainedAllocator);
    if (iVar13 != 0) {
      if (iVar13 == 2) {
        bVar18 = true;
      }
      else {
        bVar18 = iVar13 == 0;
      }
      goto LAB_00406979;
    }
    uVar15 = uVar15 + 1;
    if (uVar15 == 5) {
      bVar18 = true;
      numPassingAllocs = 1;
LAB_00406979:
      operator_delete(__s,0x20);
      if (bVar18) {
        local_298._0_8_ = local_288;
        if (numPassingAllocs == 0) {
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_298,
                     "Not validated: pooled objects didn\'t seem to use host memory","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_330;
          std::__cxx11::string::_M_construct<char*>
                    (local_328,local_298._0_8_,local_298._0_8_ + local_298._8_8_);
        }
        else {
          std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"Ok","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_330;
          std::__cxx11::string::_M_construct<char*>
                    (local_328,local_298._0_8_,local_298._0_8_ + local_298._8_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._0_8_ != local_288) {
          operator_delete((void *)local_298._0_8_,local_288[0]._M_allocated_capacity + 1);
        }
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

tcu::TestStatus allocCallbackFailMultipleObjectsTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<Move<typename Object::Type> >	ObjectTypeSp;

	static const deUint32	numObjects			= 4;
	const bool				expectNullHandles	= isNullHandleOnAllocationFailure<typename Object::Type>(context);
	deUint32				numPassingAllocs	= 0;

	{
		vector<typename Object::Type>	handles	(numObjects);
		VkResult						result	= VK_NOT_READY;

		for (; numPassingAllocs <= numObjects; ++numPassingAllocs)
		{
			ValidateQueryBits::fillBits(handles.begin(), handles.end());	// fill with garbage

			// \note We have to use the same allocator for both resource dependencies and the object under test,
			//       because pooled objects take memory from the pool.
			DeterministicFailAllocator			objAllocator(getSystemAllocator(), DeterministicFailAllocator::MODE_DO_NOT_COUNT, 0);
			AllocationCallbackRecorder			recorder	(objAllocator.getCallbacks(), 128);
			const Environment					objEnv		(context.getPlatformInterface(),
															 context.getDeviceInterface(),
															 context.getDevice(),
															 context.getUniversalQueueFamilyIndex(),
															 context.getBinaryCollection(),
															 recorder.getCallbacks(),
															 numObjects);

			context.getTestContext().getLog()
				<< TestLog::Message
				<< "Trying to create " << numObjects << " objects with " << numPassingAllocs << " allocation" << (numPassingAllocs != 1 ? "s" : "") << " passing"
				<< TestLog::EndMessage;

			{
				const typename Object::Resources res (objEnv, params);

				objAllocator.reset(DeterministicFailAllocator::MODE_COUNT_AND_FAIL, numPassingAllocs);
				const vector<ObjectTypeSp> scopedHandles = Object::createMultiple(objEnv, res, params, &handles, &result);
			}

			if (result == VK_SUCCESS)
			{
				context.getTestContext().getLog() << TestLog::Message << "Construction of all objects succeeded! " << TestLog::EndMessage;
				break;
			}
			else
			{
				if (expectNullHandles)
				{
					for (deUint32 nullNdx = numPassingAllocs; nullNdx < numObjects; ++nullNdx)
					{
						if (handles[nullNdx] != DE_NULL)
							return tcu::TestStatus::fail("Some object handles weren't set to NULL");
					}
				}

				if (result != VK_ERROR_OUT_OF_HOST_MEMORY)
					return tcu::TestStatus::fail("Got invalid error code: " + de::toString(getResultName(result)));

				if (!validateAndLog(context.getTestContext().getLog(), recorder, 0u))
					return tcu::TestStatus::fail("Invalid allocation callback");
			}
		}
	}

	if (numPassingAllocs == 0)
	{
		if (isPooledObject<typename Object::Type>())
			return tcu::TestStatus::pass("Not validated: pooled objects didn't seem to use host memory");
		else
			return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks not called");
	}
	else
		return tcu::TestStatus::pass("Ok");
}